

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

void duckdb::TupleDataCollectionWithinCollectionScatter<duckdb::ArrayVector>
               (Vector *child_list,TupleDataVectorFormat *child_list_format,
               SelectionVector *append_sel,idx_t append_count,TupleDataLayout *layout,
               Vector *row_locations,Vector *heap_locations,idx_t col_idx,
               UnifiedVectorFormat *list_data,
               vector<duckdb::TupleDataScatterFunction,_true> *child_functions)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  byte bVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  TemplatedValidityData<unsigned_char> *pTVar10;
  long lVar11;
  Vector *pVVar12;
  const_reference pvVar13;
  pointer pCVar14;
  const_reference pvVar15;
  long lVar16;
  ulong uVar17;
  idx_t iVar18;
  idx_t iVar19;
  long *plVar20;
  _Head_base<0UL,_unsigned_char_*,_false> _Var21;
  ulong uVar22;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true> local_80;
  ulong local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  Vector *local_50;
  TupleDataLayout *local_48;
  Vector *local_40;
  ulong local_38;
  
  local_50 = child_list;
  local_48 = layout;
  local_40 = row_locations;
  if (append_count != 0) {
    pSVar1 = list_data->sel;
    pdVar2 = list_data->data;
    pSVar3 = (child_list_format->unified).sel;
    pdVar4 = (child_list_format->unified).data;
    pdVar5 = heap_locations->data;
    iVar18 = 0;
    do {
      iVar19 = iVar18;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar19 = (idx_t)append_sel->sel_vector[iVar18];
      }
      psVar6 = pSVar1->sel_vector;
      if (psVar6 != (sel_t *)0x0) {
        iVar19 = (idx_t)psVar6[iVar19];
      }
      puVar7 = (list_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar7 == (unsigned_long *)0x0) || ((puVar7[iVar19 >> 6] >> (iVar19 & 0x3f) & 1) != 0)) {
        uVar17 = *(ulong *)(pdVar2 + iVar19 * 0x10 + 8);
        if (uVar17 != 0) {
          _Var21._M_head_impl = *(uchar **)(pdVar5 + iVar18 * 8);
          local_80.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_80.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_70 = uVar17;
          if (_Var21._M_head_impl == (uchar *)0x0) {
            local_38 = uVar17;
            make_buffer<duckdb::TemplatedValidityData<unsigned_char>,unsigned_long&>
                      ((duckdb *)&local_68,&local_38);
            p_Var9 = p_Stack_60;
            local_80.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = local_68;
            this._M_pi = local_80.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_80.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var9;
            if ((this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi),
               p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true>::operator->
                                (&local_80);
            _Var21._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          }
          lVar11 = (uVar17 + 7 >> 3) - 1;
          if (lVar11 != 0) {
            lVar16 = 0;
            do {
              _Var21._M_head_impl[lVar16] = 0xff;
              lVar16 = lVar16 + 1;
            } while (lVar11 != lVar16);
          }
          plVar20 = (long *)(pdVar2 + iVar19 * 0x10);
          _Var21._M_head_impl[lVar11] =
               _Var21._M_head_impl[lVar11] | -((uVar17 & 7) == 0) | ~(-1 << ((byte)uVar17 & 7));
          lVar11 = plVar20[1];
          lVar16 = (lVar11 + 7U >> 3) + *(long *)(pdVar5 + iVar18 * 8);
          *(long *)(pdVar5 + iVar18 * 8) = lVar16 + lVar11 * 8;
          if (lVar11 != 0) {
            uVar17 = 0;
            do {
              uVar22 = *plVar20 + uVar17;
              psVar6 = pSVar3->sel_vector;
              if (psVar6 != (sel_t *)0x0) {
                uVar22 = (ulong)psVar6[uVar22];
              }
              puVar7 = (child_list_format->unified).validity.
                       super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if ((puVar7 == (unsigned_long *)0x0) ||
                 ((puVar7[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)) {
                *(undefined8 *)(lVar16 + uVar17 * 8) = *(undefined8 *)(pdVar4 + uVar22 * 0x10 + 8);
              }
              else {
                bVar8 = (byte)uVar17 & 7;
                _Var21._M_head_impl[uVar17 >> 3] =
                     _Var21._M_head_impl[uVar17 >> 3] & (-2 << bVar8 | 0xfeU >> 8 - bVar8);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < (ulong)plVar20[1]);
          }
          if (local_80.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 != append_count);
  }
  pVVar12 = ArrayVector::GetEntry(local_50);
  pvVar13 = vector<duckdb::TupleDataVectorFormat,_true>::operator[](&child_list_format->children,0);
  pCVar14 = unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>,_true>
            ::operator->(&pvVar13->combined_list_data);
  pvVar15 = vector<duckdb::TupleDataScatterFunction,_true>::operator[](child_functions,0);
  (*pvVar15->function)
            (pVVar12,pvVar13,append_sel,append_count,local_48,local_40,heap_locations,col_idx,
             &pCVar14->combined_data,&pvVar15->child_functions);
  return;
}

Assistant:

static void TupleDataCollectionWithinCollectionScatter(const Vector &child_list,
                                                       const TupleDataVectorFormat &child_list_format,
                                                       const SelectionVector &append_sel, const idx_t append_count,
                                                       const TupleDataLayout &layout, const Vector &row_locations,
                                                       Vector &heap_locations, const idx_t col_idx,
                                                       const UnifiedVectorFormat &list_data,
                                                       const vector<TupleDataScatterFunction> &child_functions) {
	// Parent list data
	const auto &list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &child_list_data = child_list_format.unified;
	const auto &child_list_sel = *child_list_data.sel;
	const auto child_list_entries = UnifiedVectorFormat::GetData<list_entry_t>(child_list_data);
	const auto &child_list_validity = child_list_data.validity;

	// Target
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child list
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip heap pointer over it
		auto &target_heap_location = target_heap_locations[i];
		ValidityBytes child_mask(target_heap_location, list_length);
		child_mask.SetAllValid(list_length);
		target_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Get the start to the fixed-size data and skip the heap pointer over it
		const auto child_data_location = target_heap_location;
		target_heap_location += list_length * sizeof(uint64_t);

		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_list_idx = child_list_sel.get_index(list_offset + child_i);
			if (child_list_validity.RowIsValid(child_list_idx)) {
				const auto &child_list_length = child_list_entries[child_list_idx].length;
				Store<uint64_t>(child_list_length, child_data_location + child_i * sizeof(uint64_t));
			} else {
				child_mask.SetInvalidUnsafe(child_i);
			}
		}
	}

	// Recurse
	D_ASSERT(child_functions.size() == 1);
	auto &child_vec = COLLECTION_VECTOR::GetEntry(child_list);
	auto &child_format = child_list_format.children[0];
	auto &combined_child_list_data = child_format.combined_list_data->combined_data;
	const auto &child_function = child_functions[0];
	child_function.function(child_vec, child_format, append_sel, append_count, layout, row_locations, heap_locations,
	                        col_idx, combined_child_list_data, child_function.child_functions);
}